

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderLibraryCase.cpp
# Opt level: O2

void deqp::gls::generateUniformDeclarations(ostream *dst,ValueBlock *valueBlock)

{
  pointer pVVar1;
  char *pcVar2;
  long lVar3;
  ostream *poVar4;
  long lVar5;
  size_t ndx;
  ulong uVar6;
  string *psVar7;
  
  lVar5 = 0x18;
  for (uVar6 = 0;
      pVVar1 = (valueBlock->uniforms).
               super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar6 < (ulong)(((long)(valueBlock->uniforms).
                             super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) / 0x50);
      uVar6 = uVar6 + 1) {
    psVar7 = (string *)((long)&(pVVar1->type).m_type + lVar5);
    pcVar2 = glu::getDataTypeName(*(DataType *)((long)pVVar1 + lVar5 + -0x10));
    lVar3 = std::__cxx11::string::find((char)psVar7,0x2e);
    if (lVar3 == -1) {
      poVar4 = std::operator<<(dst,"uniform ");
      poVar4 = std::operator<<(poVar4,pcVar2);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::operator<<(poVar4,psVar7);
      std::operator<<(poVar4,";\n");
    }
    lVar5 = lVar5 + 0x50;
  }
  return;
}

Assistant:

static void generateUniformDeclarations (std::ostream& dst, const ValueBlock& valueBlock)
{
	for (size_t ndx = 0; ndx < valueBlock.uniforms.size(); ndx++)
	{
		const Value&		val		= valueBlock.uniforms[ndx];
		const char* const	typeStr	= getDataTypeName(val.type.getBasicType());

		if (val.name.find('.') == string::npos)
			dst << "uniform " << typeStr << " " << val.name << ";\n";
	}
}